

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DeepTiledOutputFile::breakTile
          (DeepTiledOutputFile *this,int dx,int dy,int lx,int ly,int offset,int length,char c)

{
  pthread_mutex_t *__mutex;
  uint64_t uVar1;
  OutputStreamMutex *pOVar2;
  OStream *pOVar3;
  int iVar4;
  uint64_t *puVar5;
  ostream *poVar6;
  char *pcVar7;
  ArgExc *this_00;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  puVar5 = TileOffsets::operator()(&this->_data->tileOffsets,dx,dy,lx,ly);
  uVar1 = *puVar5;
  if (uVar1 != 0) {
    pOVar2 = this->_data->_streamData;
    pOVar2->currentPosition = 0;
    pOVar3 = pOVar2->os;
    (*pOVar3->_vptr_OStream[4])(pOVar3,uVar1 + (long)offset);
    if (0 < length) {
      do {
        pOVar3 = this->_data->_streamData->os;
        (*pOVar3->_vptr_OStream[2])(pOVar3,&c,1);
        length = length + -1;
      } while (length != 0);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Cannot overwrite tile (",0x17);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,dx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,dy);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,lx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,ly);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"). The tile has not yet been stored in file \"",0x2d);
  pcVar7 = OStream::fileName(this->_data->_streamData->os);
  poVar6 = std::operator<<(poVar6,pcVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,local_1b8);
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledOutputFile::breakTile (
    int dx, int dy, int lx, int ly, int offset, int length, char c)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    uint64_t position = _data->tileOffsets (dx, dy, lx, ly);

    if (!position)
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot overwrite tile "
            "(" << dx
                << ", " << dy << ", " << lx << "," << ly
                << "). "
                   "The tile has not yet been stored in "
                   "file \""
                << fileName () << "\".");

    _data->_streamData->currentPosition = 0;
    _data->_streamData->os->seekp (position + offset);

    for (int i = 0; i < length; ++i)
        _data->_streamData->os->write (&c, 1);
}